

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnSetStr(XL *out,char *key,char *value)

{
  XL pvVar1;
  int iVar2;
  string *this;
  allocator local_41;
  string local_40 [32];
  
  pvVar1 = *out;
  iVar2 = strcmp(key,"task");
  if (iVar2 == 0) {
    iVar2 = strcmp(value,"binary");
    if (iVar2 == 0) {
      std::__cxx11::string::string(local_40,"cross-entropy",&local_41);
    }
    else {
      iVar2 = strcmp(value,"reg");
      if (iVar2 == 0) {
        std::__cxx11::string::string(local_40,"squared",&local_41);
      }
      else {
        std::__cxx11::string::string(local_40,"unknow",&local_41);
      }
    }
  }
  else {
    iVar2 = strcmp(key,"metric");
    if (iVar2 == 0) {
      std::__cxx11::string::string(local_40,value,&local_41);
      this = (string *)((long)pvVar1 + 0x48);
      goto LAB_001438fb;
    }
    iVar2 = strcmp(key,"log");
    if (iVar2 == 0) {
      std::__cxx11::string::string(local_40,value,&local_41);
      this = (string *)((long)pvVar1 + 0x1c0);
      goto LAB_001438fb;
    }
    iVar2 = strcmp(key,"loss");
    if (iVar2 != 0) {
      iVar2 = strcmp(key,"opt");
      if (iVar2 != 0) {
        return 0;
      }
      std::__cxx11::string::string(local_40,value,&local_41);
      std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x70),local_40);
      std::__cxx11::string::~string(local_40);
      return 0;
    }
    std::__cxx11::string::string(local_40,value,&local_41);
  }
  this = (string *)((long)pvVar1 + 0x28);
LAB_001438fb:
  std::__cxx11::string::operator=(this,local_40);
  std::__cxx11::string::~string(local_40);
  return 0;
}

Assistant:

XL_DLL int XLearnSetStr(XL *out, const char *key, const char *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "task") == 0) {
    if (strcmp(value, "binary") == 0) {
      xl->GetHyperParam().loss_func = std::string("cross-entropy");
    } else if (strcmp(value, "reg") == 0) {
      xl->GetHyperParam().loss_func = std::string("squared");
    } else {
      xl->GetHyperParam().loss_func = std::string("unknow");
    }
  } else if (strcmp(key, "metric") == 0) {
    xl->GetHyperParam().metric = std::string(value);
  } else if (strcmp(key, "log") == 0) {
    xl->GetHyperParam().log_file = std::string(value);
  } else if (strcmp(key, "loss") == 0) {
    xl->GetHyperParam().loss_func = std::string(value);
  } else if (strcmp(key, "opt") == 0) {
    xl->GetHyperParam().opt_type = std::string(value);
  }
  API_END();
}